

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void heightOfSelect(Select *p,int *pnHeight)

{
  int iVar1;
  
  for (; p != (Select *)0x0; p = p->pPrior) {
    if ((p->pWhere != (Expr *)0x0) && (iVar1 = p->pWhere->nHeight, *pnHeight < iVar1)) {
      *pnHeight = iVar1;
    }
    if ((p->pHaving != (Expr *)0x0) && (iVar1 = p->pHaving->nHeight, *pnHeight < iVar1)) {
      *pnHeight = iVar1;
    }
    if ((p->pLimit != (Expr *)0x0) && (iVar1 = p->pLimit->nHeight, *pnHeight < iVar1)) {
      *pnHeight = iVar1;
    }
    if ((p->pOffset != (Expr *)0x0) && (iVar1 = p->pOffset->nHeight, *pnHeight < iVar1)) {
      *pnHeight = iVar1;
    }
    heightOfExprList(p->pEList,pnHeight);
    heightOfExprList(p->pGroupBy,pnHeight);
    heightOfExprList(p->pOrderBy,pnHeight);
  }
  return;
}

Assistant:

static void heightOfSelect(Select *p, int *pnHeight){
  if( p ){
    heightOfExpr(p->pWhere, pnHeight);
    heightOfExpr(p->pHaving, pnHeight);
    heightOfExpr(p->pLimit, pnHeight);
    heightOfExpr(p->pOffset, pnHeight);
    heightOfExprList(p->pEList, pnHeight);
    heightOfExprList(p->pGroupBy, pnHeight);
    heightOfExprList(p->pOrderBy, pnHeight);
    heightOfSelect(p->pPrior, pnHeight);
  }
}